

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_compute_compact_branch
               (DisasContext_conflict6 *ctx,uint32_t opc,int rs,int rt,int32_t offset)

{
  byte *pbVar1;
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  target_ulong tVar2;
  target_ulong tVar3;
  TCGLabel *l;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  target_ulong tVar6;
  uintptr_t o_3;
  TCGCond TVar7;
  long arg;
  uintptr_t o_6;
  uint uVar8;
  uintptr_t o_1;
  uint uVar9;
  uintptr_t o_4;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  uVar9 = ctx->hflags;
  if ((uVar9 & 0x87f800) != 0) {
    generate_exception_end(ctx,0x14);
    goto LAB_00886a95;
  }
  uVar8 = uVar9 >> 10 & 1;
  arg = (long)offset;
  if (opc == 0xc8000000) {
LAB_00886651:
    tVar6 = (ctx->base).pc_next + arg + 4;
    tVar3 = (long)(int)tVar6;
    if ((uVar9 >> 9 & 1) == 0) {
      tVar3 = tVar6;
    }
    ctx->btarget = tVar3;
LAB_0088696f:
    uVar9 = 0x2000;
    switch((opc + 0x38000000) * 0x10 | opc + 0x38000000 >> 0x1c) {
    case 1:
      break;
    case 2:
      tcg_gen_movi_i64_mips64el
                (tcg_ctx,tcg_ctx->cpu_gpr[0x1f],(ulong)(uVar8 | 4) + (ctx->base).pc_next);
    case 0:
      uVar9 = 0x800;
      break;
    case 3:
      tcg_gen_movi_i64_mips64el
                (tcg_ctx,tcg_ctx->cpu_gpr[0x1f],(ulong)(uVar8 | 4) + (ctx->base).pc_next);
      break;
    default:
      goto switchD_00886991_default;
    }
    ctx->hflags = ctx->hflags | uVar9;
    gen_branch(ctx,4);
  }
  else {
    if (opc == 0xd8000000) {
LAB_008864cc:
      if (rs != 0) {
        gen_load_gpr(tcg_ctx,t,rs);
        tVar3 = (ctx->base).pc_next + arg + 4;
LAB_00886597:
        tVar6 = (long)(int)tVar3;
        if ((ctx->hflags >> 9 & 1) == 0) {
          tVar6 = tVar3;
        }
        ctx->btarget = tVar6;
LAB_008865aa:
        l = gen_new_label_mips64el(tcg_ctx);
        save_cpu_state(ctx,0);
        if (opc == 0xd8000000) {
          tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t,0,l);
        }
        else if (opc == 0xf8000000) {
          TVar7 = TCG_COND_EQ;
          pTVar4 = t;
LAB_00886a31:
          tcg_gen_brcondi_i64_mips64el(tcg_ctx,TVar7,pTVar4,0,l);
        }
        else {
          pTVar4 = t_00;
          if (opc == 0x60000000) {
LAB_00886672:
            if (rt <= rs) {
              pTVar4 = tcg_temp_new_i64(tcg_ctx);
              pTVar5 = tcg_temp_new_i64(tcg_ctx);
              ret = tcg_temp_new_i64(tcg_ctx);
              ret_00 = tcg_temp_new_i64(tcg_ctx);
              gen_load_gpr(tcg_ctx,t,rs);
              gen_load_gpr(tcg_ctx,t_00,rt);
              tcg_gen_ext32s_i64_mips64el(tcg_ctx,pTVar4,t);
              tcg_gen_setcond_i64_mips64el(tcg_ctx,TCG_COND_NE,ret_00,pTVar4,t);
              tcg_gen_ext32s_i64_mips64el(tcg_ctx,pTVar5,t_00);
              tcg_gen_setcond_i64_mips64el(tcg_ctx,TCG_COND_NE,ret,pTVar5,t_00);
              tcg_gen_or_i64_mips64el(tcg_ctx,ret_00,ret_00,ret);
              tcg_gen_add_i64(tcg_ctx,ret,pTVar4,pTVar5);
              tcg_gen_ext32s_i64_mips64el(tcg_ctx,ret,ret);
              tcg_gen_xor_i64_mips64el(tcg_ctx,pTVar4,pTVar4,pTVar5);
              tcg_gen_xor_i64_mips64el(tcg_ctx,pTVar5,ret,pTVar5);
              tcg_gen_andc_i64_mips64el(tcg_ctx,pTVar4,pTVar5,pTVar4);
              tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_LT,ret,pTVar4,0);
              tcg_gen_or_i64_mips64el(tcg_ctx,ret,ret,ret_00);
              tcg_gen_brcondi_i64_mips64el(tcg_ctx,opc == 0x20000000 ^ TCG_COND_NE,ret,0,l);
              tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
              tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
              tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
              tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
              goto LAB_00886a74;
            }
            if (rs == 0) {
              if (opc == 0x20000000) {
                TVar7 = TCG_COND_NE;
              }
              else {
                TVar7 = TCG_COND_EQ;
              }
              goto LAB_00886a31;
            }
            if (opc == 0x20000000) {
              TVar7 = TCG_COND_NE;
            }
            else {
              TVar7 = TCG_COND_EQ;
            }
          }
          else {
            if (opc == 0x1c000000) {
              if (rt == 0 || rs != 0) {
                if (((rt == 0) || (rs == 0)) || (rs != rt)) {
                  TVar7 = TCG_COND_GEU;
                  goto LAB_00886a6c;
                }
LAB_00886a26:
                TVar7 = TCG_COND_GE;
              }
              else {
LAB_008868cb:
                TVar7 = TCG_COND_LE;
              }
              goto LAB_00886a31;
            }
            if (opc == 0x20000000) goto LAB_00886672;
            if (opc == 0x58000000) {
              if (rt != 0 && rs == 0) {
LAB_00886896:
                TVar7 = TCG_COND_GT;
                goto LAB_00886a31;
              }
              if (((rt != 0) && (rs != 0)) && (rs == rt)) {
LAB_00886a11:
                TVar7 = TCG_COND_LT;
                goto LAB_00886a31;
              }
              TVar7 = TCG_COND_LT;
            }
            else if (opc == 0x5c000000) {
              if (rt != 0 && rs == 0) goto LAB_008868cb;
              if (((rt != 0) && (rs != 0)) && (rs == rt)) goto LAB_00886a26;
              TVar7 = TCG_COND_GE;
            }
            else {
              if (opc != 0x18000000) {
                generate_exception_end(ctx,0x14);
                goto LAB_00886a95;
              }
              if (rt != 0 && rs == 0) goto LAB_00886896;
              if (((rt != 0) && (rs != 0)) && (rs == rt)) goto LAB_00886a11;
              TVar7 = TCG_COND_LTU;
            }
          }
LAB_00886a6c:
          tcg_gen_brcond_i64_mips64el(tcg_ctx,TVar7,t,t_00,l);
        }
LAB_00886a74:
        gen_goto_tb(ctx,1,ctx->btarget);
        gen_set_label(tcg_ctx,l);
        pbVar1 = (byte *)((long)&ctx->hflags + 2);
        *pbVar1 = *pbVar1 | 0x80;
        goto LAB_00886a95;
      }
      pTVar4 = tcg_temp_new_i64(tcg_ctx);
      pTVar5 = tcg_temp_new_i64(tcg_ctx);
      gen_load_gpr(tcg_ctx,pTVar4,rt);
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar5,arg);
      gen_op_addr_add(ctx,tcg_ctx->btarget,pTVar4,pTVar5);
      tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
      goto LAB_0088696f;
    }
    if (opc == 0xe8000000) goto LAB_00886651;
    if (opc == 0xf8000000) goto LAB_008864cc;
    if ((opc == 0x18000000) || (opc == 0x1c000000)) {
      if (rs == 0 || rs == rt) {
        tcg_gen_movi_i64_mips64el
                  (tcg_ctx,tcg_ctx->cpu_gpr[0x1f],(ulong)(uVar8 | 4) + (ctx->base).pc_next);
      }
      gen_load_gpr(tcg_ctx,t,rs);
      gen_load_gpr(tcg_ctx,t_00,rt);
      tVar3 = (ctx->base).pc_next + arg + 4;
      goto LAB_00886597;
    }
    if (opc == 0x60000000) {
LAB_0088644c:
      gen_load_gpr(tcg_ctx,t,rs);
      gen_load_gpr(tcg_ctx,t_00,rt);
      tVar3 = (ctx->base).pc_next;
      tVar2 = tVar3 + arg + 4;
      tVar6 = (long)(int)tVar2;
      if ((ctx->hflags >> 9 & 1) == 0) {
        tVar6 = tVar2;
      }
      ctx->btarget = tVar6;
      if (-1 < rt && rs == 0) {
        tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[0x1f],tVar3 + 4 + (ulong)uVar8);
      }
      goto LAB_008865aa;
    }
    if ((opc == 0x58000000) || (opc == 0x5c000000)) {
      gen_load_gpr(tcg_ctx,t,rs);
      gen_load_gpr(tcg_ctx,t_00,rt);
      tVar3 = (ctx->base).pc_next + arg + 4;
      goto LAB_00886597;
    }
    if (opc == 0x20000000) goto LAB_0088644c;
switchD_00886991_default:
    generate_exception_end(ctx,0x14);
  }
LAB_00886a95:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_compute_compact_branch(DisasContext *ctx, uint32_t opc,
                                       int rs, int rt, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    int m16_lowbit = (ctx->hflags & MIPS_HFLAG_M16) != 0;

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
#ifdef MIPS_DEBUG_DISAS
        LOG_DISAS("Branch in delay / forbidden slot at PC 0x" TARGET_FMT_lx
                  "\n", ctx->base.pc_next);
#endif
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    /* Load needed operands and calculate btarget */
    switch (opc) {
    /* compact branch */
    case OPC_BOVC: /* OPC_BEQZALC, OPC_BEQC */
    case OPC_BNVC: /* OPC_BNEZALC, OPC_BNEC */
        gen_load_gpr(tcg_ctx, t0, rs);
        gen_load_gpr(tcg_ctx, t1, rt);
        bcond_compute = 1;
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        if (rs <= rt && rs == 0) {
            /* OPC_BEQZALC, OPC_BNEZALC */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
        }
        break;
    case OPC_BLEZC: /* OPC_BGEZC, OPC_BGEC */
    case OPC_BGTZC: /* OPC_BLTZC, OPC_BLTC */
        gen_load_gpr(tcg_ctx, t0, rs);
        gen_load_gpr(tcg_ctx, t1, rt);
        bcond_compute = 1;
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        break;
    case OPC_BLEZALC: /* OPC_BGEZALC, OPC_BGEUC */
    case OPC_BGTZALC: /* OPC_BLTZALC, OPC_BLTUC */
        if (rs == 0 || rs == rt) {
            /* OPC_BLEZALC, OPC_BGEZALC */
            /* OPC_BGTZALC, OPC_BLTZALC */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
        }
        gen_load_gpr(tcg_ctx, t0, rs);
        gen_load_gpr(tcg_ctx, t1, rt);
        bcond_compute = 1;
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        break;
    case OPC_BC:
    case OPC_BALC:
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        break;
    case OPC_BEQZC:
    case OPC_BNEZC:
        if (rs != 0) {
            /* OPC_BEQZC, OPC_BNEZC */
            gen_load_gpr(tcg_ctx, t0, rs);
            bcond_compute = 1;
            ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        } else {
            /* OPC_JIC, OPC_JIALC */
            TCGv tbase = tcg_temp_new(tcg_ctx);
            TCGv toffset = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, tbase, rt);
            tcg_gen_movi_tl(tcg_ctx, toffset, offset);
            gen_op_addr_add(ctx, tcg_ctx->btarget, tbase, toffset);
            tcg_temp_free(tcg_ctx, tbase);
            tcg_temp_free(tcg_ctx, toffset);
        }
        break;
    default:
        MIPS_INVAL("Compact branch/jump");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    if (bcond_compute == 0) {
        /* Uncoditional compact branch */
        switch (opc) {
        case OPC_JIALC:
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
            /* Fallthrough */
        case OPC_JIC:
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        case OPC_BALC:
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
            /* Fallthrough */
        case OPC_BC:
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        default:
            MIPS_INVAL("Compact branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }

        /* Generating branch here as compact branches don't have delay slot */
        gen_branch(ctx, 4);
    } else {
        /* Conditional compact branch */
        TCGLabel *fs = gen_new_label(tcg_ctx);
        save_cpu_state(ctx, 0);

        switch (opc) {
        case OPC_BLEZALC: /* OPC_BGEZALC, OPC_BGEUC */
            if (rs == 0 && rt != 0) {
                /* OPC_BLEZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LE), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BGEZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GE), t1, 0, fs);
            } else {
                /* OPC_BGEUC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GEU), t0, t1, fs);
            }
            break;
        case OPC_BGTZALC: /* OPC_BLTZALC, OPC_BLTUC */
            if (rs == 0 && rt != 0) {
                /* OPC_BGTZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GT), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BLTZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LT), t1, 0, fs);
            } else {
                /* OPC_BLTUC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LTU), t0, t1, fs);
            }
            break;
        case OPC_BLEZC: /* OPC_BGEZC, OPC_BGEC */
            if (rs == 0 && rt != 0) {
                /* OPC_BLEZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LE), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BGEZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GE), t1, 0, fs);
            } else {
                /* OPC_BGEC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GE), t0, t1, fs);
            }
            break;
        case OPC_BGTZC: /* OPC_BLTZC, OPC_BLTC */
            if (rs == 0 && rt != 0) {
                /* OPC_BGTZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GT), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BLTZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LT), t1, 0, fs);
            } else {
                /* OPC_BLTC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LT), t0, t1, fs);
            }
            break;
        case OPC_BOVC: /* OPC_BEQZALC, OPC_BEQC */
        case OPC_BNVC: /* OPC_BNEZALC, OPC_BNEC */
            if (rs >= rt) {
                /* OPC_BOVC, OPC_BNVC */
                TCGv t2 = tcg_temp_new(tcg_ctx);
                TCGv t3 = tcg_temp_new(tcg_ctx);
                TCGv t4 = tcg_temp_new(tcg_ctx);
                TCGv input_overflow = tcg_temp_new(tcg_ctx);

                gen_load_gpr(tcg_ctx, t0, rs);
                gen_load_gpr(tcg_ctx, t1, rt);
                tcg_gen_ext32s_tl(tcg_ctx, t2, t0);
                tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, input_overflow, t2, t0);
                tcg_gen_ext32s_tl(tcg_ctx, t3, t1);
                tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, t4, t3, t1);
                tcg_gen_or_tl(tcg_ctx, input_overflow, input_overflow, t4);

                tcg_gen_add_tl(tcg_ctx, t4, t2, t3);
                tcg_gen_ext32s_tl(tcg_ctx, t4, t4);
                tcg_gen_xor_tl(tcg_ctx, t2, t2, t3);
                tcg_gen_xor_tl(tcg_ctx, t3, t4, t3);
                tcg_gen_andc_tl(tcg_ctx, t2, t3, t2);
                tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, t4, t2, 0);
                tcg_gen_or_tl(tcg_ctx, t4, t4, input_overflow);
                if (opc == OPC_BOVC) {
                    /* OPC_BOVC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t4, 0, fs);
                } else {
                    /* OPC_BNVC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t4, 0, fs);
                }
                tcg_temp_free(tcg_ctx, input_overflow);
                tcg_temp_free(tcg_ctx, t4);
                tcg_temp_free(tcg_ctx, t3);
                tcg_temp_free(tcg_ctx, t2);
            } else if (rs < rt && rs == 0) {
                /* OPC_BEQZALC, OPC_BNEZALC */
                if (opc == OPC_BEQZALC) {
                    /* OPC_BEQZALC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t1, 0, fs);
                } else {
                    /* OPC_BNEZALC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t1, 0, fs);
                }
            } else {
                /* OPC_BEQC, OPC_BNEC */
                if (opc == OPC_BEQC) {
                    /* OPC_BEQC */
                    tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t0, t1, fs);
                } else {
                    /* OPC_BNEC */
                    tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t0, t1, fs);
                }
            }
            break;
        case OPC_BEQZC:
            tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t0, 0, fs);
            break;
        case OPC_BNEZC:
            tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t0, 0, fs);
            break;
        default:
            MIPS_INVAL("Compact conditional branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }

        /* Generating branch here as compact branches don't have delay slot */
        gen_goto_tb(ctx, 1, ctx->btarget);
        gen_set_label(tcg_ctx, fs);

        ctx->hflags |= MIPS_HFLAG_FBNSLOT;
    }

out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}